

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

iter_type __thiscall
booster::locale::impl_icu::num_format<wchar_t>::do_real_put<unsigned_long_long>
          (num_format<wchar_t> *this,iter_type out,ios_base *ios,char_type_conflict fill,
          unsigned_long_long val)

{
  char_type_conflict *pcVar1;
  bool bVar2;
  char_type_conflict cVar3;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long lVar4;
  uint uVar5;
  long lVar6;
  iter_type iVar7;
  iter_type iVar8;
  iter_type __s;
  size_t code_points;
  base_formatter local_78;
  formatter<wchar_t> local_68;
  num_format<wchar_t> *local_60;
  long local_58;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  __s._M_sbuf = out._M_sbuf;
  uVar5 = out._8_4_;
  local_60 = this;
  bVar2 = num_base::use_parent<unsigned_long_long>(ios,val);
  if (bVar2) {
    bVar2 = true;
    local_78._vptr_base_formatter = (_func_int **)0x0;
  }
  else {
    formatter<wchar_t>::create(&local_68,ios,&local_60->loc_,&local_60->enc_);
    local_78 = local_68.super_base_formatter._vptr_base_formatter;
    local_68.super_base_formatter._vptr_base_formatter = (base_formatter)(_func_int **)0x0;
    bVar2 = local_78._vptr_base_formatter == (_func_int **)0x0;
  }
  if (bVar2) {
    __s._8_4_ = uVar5 & 0xff;
    __s._12_4_ = 0;
    iVar7 = std::num_put<wchar_t,_std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>_>::
            _M_insert_int<unsigned_long_long>
                      (&local_60->
                        super_num_put<wchar_t,_std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>_>
                       ,__s,ios,fill,val);
    uVar5 = iVar7._8_4_;
  }
  else {
    (**(code **)(*local_78._vptr_base_formatter + 0x18))
              (&local_50,local_78._vptr_base_formatter,val,&local_58);
    lVar4 = *(long *)(ios + 0x10) - local_58;
    if (lVar4 == 0 || *(long *)(ios + 0x10) < local_58) {
      lVar4 = 0;
      lVar6 = 0;
    }
    else {
      lVar6 = 0;
      if ((*(uint *)(ios + 0x18) & 0xb0) != 0x20) {
        lVar6 = lVar4;
      }
      lVar4 = lVar4 - lVar6;
    }
    if (0 < lVar6) {
      lVar6 = lVar6 + 1;
      do {
        if ((uVar5 & 1) == 0) {
          pcVar1 = *(char_type_conflict **)(__s._M_sbuf + 0x28);
          if (pcVar1 < *(char_type_conflict **)(__s._M_sbuf + 0x30)) {
            *pcVar1 = fill;
            *(char_type_conflict **)(__s._M_sbuf + 0x28) = pcVar1 + 1;
            cVar3 = fill;
          }
          else {
            cVar3 = (**(code **)(*(long *)__s._M_sbuf + 0x68))(__s._M_sbuf,fill);
          }
          uVar5 = uVar5 & 0xff;
          if (cVar3 == -1) {
            uVar5 = 1;
          }
        }
        lVar6 = lVar6 + -1;
      } while (1 < lVar6);
    }
    if ((0 < local_48) && ((uVar5 & 1) == 0)) {
      (**(code **)(*(long *)__s._M_sbuf + 0x60))(__s._M_sbuf,local_50);
      local_48 = extraout_RDX;
    }
    if (0 < lVar4) {
      lVar4 = lVar4 + 1;
      do {
        if ((uVar5 & 1) == 0) {
          pcVar1 = *(char_type_conflict **)(__s._M_sbuf + 0x28);
          if (pcVar1 < *(char_type_conflict **)(__s._M_sbuf + 0x30)) {
            *pcVar1 = fill;
            *(char_type_conflict **)(__s._M_sbuf + 0x28) = pcVar1 + 1;
            cVar3 = fill;
          }
          else {
            cVar3 = (**(code **)(*(long *)__s._M_sbuf + 0x68))(__s._M_sbuf,fill);
            local_48 = extraout_RDX_00;
          }
          uVar5 = uVar5 & 0xff;
          if (cVar3 == -1) {
            uVar5 = 1;
          }
        }
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    *(undefined8 *)(ios + 0x10) = 0;
    if (local_50 != local_40) {
      operator_delete(local_50);
      local_48 = extraout_RDX_01;
    }
    iVar7._8_8_ = local_48;
    iVar7._M_sbuf = __s._M_sbuf;
  }
  if (local_78._vptr_base_formatter != (_func_int **)0x0) {
    (**(code **)(*local_78._vptr_base_formatter + 8))(local_78._vptr_base_formatter);
  }
  iVar8._8_4_ = uVar5;
  iVar8._M_sbuf = iVar7._M_sbuf;
  iVar8._12_4_ = 0;
  return iVar8;
}

Assistant:

iter_type do_real_put (iter_type out, std::ios_base &ios, char_type fill, ValueType val) const
    {
        formatter_ptr formatter;
        
        if(use_parent<ValueType>(ios,val) || (formatter = formatter_type::create(ios,loc_,enc_)).get() == 0) {
            return std::num_put<char_type>::do_put(out,ios,fill,val);
        }
        
        size_t code_points;
        typedef typename details::cast_traits<ValueType>::cast_type cast_type;
        string_type const &str = formatter->format(static_cast<cast_type>(val),code_points);
        std::streamsize on_left=0,on_right = 0,points = code_points;
        if(points < ios.width()) {
            std::streamsize n = ios.width() - points;
            
            std::ios_base::fmtflags flags = ios.flags() & std::ios_base::adjustfield;
            
            //
            // We do not really know internal point, so we assume that it does not
            // exist. So according to the standard field should be right aligned
            //
            if(flags != std::ios_base::left)
                on_left = n;
            on_right = n - on_left;
        }
        while(on_left > 0) {
            *out++ = fill;
            on_left--;
        }
        std::copy(str.begin(),str.end(),out);
        while(on_right > 0) {
            *out++ = fill;
            on_right--;
        }
        ios.width(0);
        return out;

    }